

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O1

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::InstMatcher::matchNextAux
          (InstMatcher *this,TermList queryTerm,TermList nodeTerm,bool separate)

{
  bool bVar1;
  pair<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::InstMatcher::TermSpec>
  *ppVar2;
  pair<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::InstMatcher::TermSpec>
  *ppVar3;
  bool bVar4;
  uint uVar5;
  Entry *pEVar6;
  socklen_t sVar7;
  socklen_t sVar8;
  undefined7 in_register_00000009;
  ulong uVar9;
  TermList var;
  TermList var_00;
  bool bVar10;
  bool bVar11;
  int iVar12;
  ulong uVar13;
  socklen_t sVar14;
  socklen_t sVar15;
  bool bVar16;
  int iVar17;
  ulong uVar18;
  TermSpec TVar19;
  bool local_65;
  TermList local_60;
  InstMatcher *local_58;
  uint local_50;
  uint local_4c;
  DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
  *local_48;
  undefined4 uStack_3c;
  undefined3 uStack_38;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000009,separate);
  bVar11 = true;
  if ((~(uint)queryTerm._content & 3) == 0) {
    queryTerm._content = queryTerm._content & 0xffffffff;
    local_60._content = queryTerm._content;
    pEVar6 = ::Lib::
             DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
             ::findEntry(&this->_bindings,&local_60);
    if (pEVar6 == (Entry *)0x0) goto LAB_0030353b;
    bVar11 = (pEVar6->_val).q;
    uStack_38 = (undefined3)((uint)*(undefined4 *)&(pEVar6->_val).field_0x4 >> 8);
    uStack_3c = *(undefined4 *)&(pEVar6->_val).field_0x1;
    queryTerm._content = (pEVar6->_val).t._content;
  }
  if ((((bVar11 & 1U) == 0) || (((uint)queryTerm._content & 3) != 1)) ||
     (local_60._content = queryTerm._content,
     pEVar6 = ::Lib::
              DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
              ::findEntry(&this->_bindings,&local_60), pEVar6 != (Entry *)0x0)) {
    local_58 = this;
    if (((((nodeTerm._content & 3) == 0) && ((*(byte *)(nodeTerm._content + 0x28) & 8) != 0)) &&
        ((uVar5 = Kernel::Term::numVarOccs((Term *)nodeTerm._content), uVar5 == 0 &&
         (((bVar11 & 1U) != 0 && ((queryTerm._content & 3) == 0)))))) &&
       (uVar5 = Kernel::Term::numVarOccs((Term *)queryTerm._content), uVar5 == 0)) {
      local_65 = queryTerm._content == nodeTerm._content;
    }
    else {
      if (matchNextAux(Kernel::TermList,Kernel::TermList,bool)::toDo == '\0') {
        matchNextAux();
      }
      if (matchNextAux(Kernel::TermList,Kernel::TermList,bool)::dsit == '\0') {
        matchNextAux();
      }
      matchNextAux::toDo._cursor = matchNextAux::toDo._stack;
      if (matchNextAux::toDo._stack == matchNextAux::toDo._end) {
        ::Lib::
        Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::InstMatcher::TermSpec>_>
        ::expand(&matchNextAux::toDo);
      }
      ppVar2 = matchNextAux::toDo._cursor;
      ((matchNextAux::toDo._cursor)->first).q = bVar11;
      *(undefined4 *)&(ppVar2->first).field_0x1 = uStack_3c;
      *(uint *)&(ppVar2->first).field_0x4 = CONCAT31(uStack_38,uStack_3c._3_1_);
      (ppVar2->first).t._content = queryTerm._content;
      (ppVar2->second).q = false;
      (ppVar2->second).t._content = nodeTerm._content;
      matchNextAux::toDo._cursor = matchNextAux::toDo._cursor + 1;
      local_65 = matchNextAux::toDo._cursor == matchNextAux::toDo._stack;
      if (!local_65) {
        local_48 = &this->_bindings;
        do {
          bVar11 = matchNextAux::toDo._cursor[-1].first.q;
          ppVar2 = matchNextAux::toDo._cursor + -1;
          bVar1 = matchNextAux::toDo._cursor[-1].second.q;
          ppVar3 = matchNextAux::toDo._cursor + -1;
          matchNextAux::toDo._cursor = matchNextAux::toDo._cursor + -1;
          Kernel::DisagreementSetIterator::reset
                    (&matchNextAux::dsit,(TermList)(ppVar2->first).t._content,
                     (TermList)(ppVar3->second).t._content,(bool)((bVar1 ^ bVar11) & 1));
          bVar4 = Kernel::DisagreementSetIterator::hasNext(&matchNextAux::dsit);
          if (bVar4) {
            local_4c = (uint)(bVar1 & 1U);
            local_50 = (uint)(bVar11 & 1U);
            do {
              var_00._content = matchNextAux::dsit._arg2._content;
              var._content = matchNextAux::dsit._arg1._content;
              uVar9 = matchNextAux::dsit._arg2._content & 3;
              bVar4 = uVar9 != 1;
              if ((bVar1 & 1U) != 0) {
                bVar4 = uVar9 != 0;
              }
              uVar13 = matchNextAux::dsit._arg2._content & 3;
              if (uVar13 == 0) {
                bVar4 = uVar9 != 0;
              }
              uVar9 = matchNextAux::dsit._arg1._content & 3;
              bVar16 = uVar9 != 1;
              if ((bVar11 & 1U) != 0) {
                bVar16 = uVar9 != 0;
              }
              uVar18 = matchNextAux::dsit._arg1._content & 3;
              matchNextAux::dsit._arg1._content = 2;
              if (uVar18 == 0) {
                bVar16 = uVar9 != 0;
              }
              if ((bVar16) || (iVar17 = 2, bVar4)) {
                iVar17 = (int)uVar18;
                sVar14 = (socklen_t)var._content;
                sVar7 = (socklen_t)matchNextAux::dsit._arg2._content;
                if ((iVar17 == 1) && ((bVar11 & 1U) != 0)) {
                  local_60._content = var._content;
                  pEVar6 = ::Lib::
                           DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
                           ::findEntry(local_48,&local_60);
                  sVar8 = sVar7;
                  sVar15 = sVar14;
                  uVar5 = local_4c;
                  if (pEVar6 != (Entry *)0x0) goto LAB_003033c2;
LAB_0030345c:
                  bind(local_58,sVar15,(sockaddr *)(ulong)uVar5,sVar8);
                  iVar17 = 5;
                }
                else {
LAB_003033c2:
                  iVar12 = (int)uVar13;
                  sVar8 = sVar14;
                  sVar15 = sVar7;
                  if ((iVar12 == 1) && ((bVar1 & 1U) != 0)) {
                    local_60._content = var_00._content;
                    pEVar6 = ::Lib::
                             DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
                             ::findEntry(local_48,&local_60);
                    uVar5 = local_50;
                    if (pEVar6 == (Entry *)0x0) goto LAB_0030345c;
                  }
                  if (iVar12 == 3) {
                    local_60._content = var_00._content;
                    pEVar6 = ::Lib::
                             DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
                             ::findEntry(local_48,&local_60);
                    uVar5 = local_50;
                    if (pEVar6 == (Entry *)0x0) goto LAB_0030345c;
                  }
                  if (iVar17 == 3) {
                    local_60._content = var._content;
                    pEVar6 = ::Lib::
                             DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
                             ::findEntry(local_48,&local_60);
                    sVar8 = sVar7;
                    sVar15 = sVar14;
                    uVar5 = local_4c;
                    if (pEVar6 == (Entry *)0x0) goto LAB_0030345c;
                  }
                  bVar10 = (bool)(bVar11 & 1U);
                  if (bVar16) {
                    TVar19 = deref(local_58,var);
                    var = TVar19.t._content;
                    bVar10 = TVar19.q;
                  }
                  bVar16 = (bool)(bVar1 & 1U);
                  if (bVar4) {
                    TVar19 = deref(local_58,var_00);
                    var_00 = TVar19.t._content;
                    bVar16 = TVar19.q;
                  }
                  if (matchNextAux::toDo._cursor == matchNextAux::toDo._end) {
                    ::Lib::
                    Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::InstMatcher::TermSpec>_>
                    ::expand(&matchNextAux::toDo);
                  }
                  ppVar2 = matchNextAux::toDo._cursor;
                  ((matchNextAux::toDo._cursor)->first).q = bVar10;
                  (ppVar2->first).t._content = var._content;
                  (ppVar2->second).q = bVar16;
                  (ppVar2->second).t._content = var_00._content;
                  matchNextAux::toDo._cursor = matchNextAux::toDo._cursor + 1;
                  iVar17 = 0;
                }
              }
              if ((iVar17 != 5) && (iVar17 != 0)) goto LAB_003034ef;
              bVar4 = Kernel::DisagreementSetIterator::hasNext(&matchNextAux::dsit);
            } while (bVar4);
            iVar17 = 0;
LAB_003034ef:
            if (iVar17 != 0) break;
          }
          local_65 = matchNextAux::toDo._cursor == matchNextAux::toDo._stack;
        } while (!local_65);
      }
    }
    if ((~(byte)local_34 & 1) != 0 || local_65 != false) {
      return local_65;
    }
    backtrack(local_58);
    return local_65;
  }
LAB_0030353b:
  bind(this,(int)queryTerm._content,(sockaddr *)0x0,(socklen_t)nodeTerm._content);
  return true;
}

Assistant:

bool SubstitutionTree<LeafData_>::InstMatcher::matchNextAux(TermList queryTerm, TermList nodeTerm, bool separate)
{
  unsigned specVar;
  TermSpec tsBinding;

  TermSpec tsNode(false, nodeTerm);

  if(queryTerm.isSpecialVar()){
    specVar = queryTerm.var();
    if(!findSpecVarBinding(specVar,tsBinding)) {
      bind(TermList(specVar,true), tsNode);
      return true;
    }
  } else {
    tsBinding = TermSpec(true, queryTerm);
  }

  if(tsBinding.q && tsBinding.t.isOrdinaryVar() && !isBound(tsBinding.t)) {
    bind(tsBinding.t, tsNode);
    return true;
  }

  bool success;

  if(nodeTerm.isTerm() && nodeTerm.term()->shared() && nodeTerm.term()->ground() &&
      tsBinding.q && tsBinding.t.isTerm() && tsBinding.t.term()->ground()) {
    success=nodeTerm.term()==tsBinding.t.term();
    goto finish;
  }

  static Stack<std::pair<TermSpec,TermSpec> > toDo;
  static DisagreementSetIterator dsit;

  toDo.reset();
  toDo.push(std::make_pair(tsBinding, tsNode));

  while(toDo.isNonEmpty()) {
    TermSpec ts1=toDo.top().first;
    TermSpec ts2=toDo.pop().second;
//    ASS(!ts2.q); //ts2 is always a node term

    dsit.reset(ts1.t, ts2.t, ts1.q!=ts2.q);
    while(dsit.hasNext()) {
      std::pair<TermList,TermList> disarg=dsit.next();
      TermList dt1=disarg.first;
      TermList dt2=disarg.second;

      bool dt1Bindable= !dt1.isTerm() && (ts1.q || !dt1.isOrdinaryVar());
      bool dt2Bindable= !dt2.isTerm() && (ts2.q || !dt2.isOrdinaryVar());

      if(!dt1Bindable && !dt2Bindable) {
	success=false;
	goto finish;
      }

      //we try to bind ordinary variables first, as binding a special
      //variable to an ordinary variable does not allow us to cut off
      //children when entering a node (a term to bind the special variable
      //may come later, so we want to keep it unbound)

      if(ts1.q && dt1.isOrdinaryVar() && !isBound(dt1)) {
	bind(dt1, TermSpec(ts2.q,dt2));
	continue;
      }
      if(ts2.q && dt2.isOrdinaryVar() && !isBound(dt2)) {
	bind(dt2, TermSpec(ts1.q,dt1));
	continue;
      }

      if(dt2.isSpecialVar() && !isBound(dt2)) {
	ASS(!ts2.q);
	bind(dt2, TermSpec(ts1.q,dt1));
	continue;
      }
      if(dt1.isSpecialVar() && !isBound(dt1)) {
	ASS(!ts1.q);
	bind(dt1, TermSpec(ts2.q,dt2));
	continue;
      }

      TermSpec deref1=TermSpec(ts1.q, dt1);
      TermSpec deref2=TermSpec(ts2.q, dt2);
      if(dt1Bindable) {
	ASS(isBound(dt1)); //if unbound, we would have assigned it earlier
	deref1=deref(dt1);
      }
      if(dt2Bindable) {
	ASS(isBound(dt2));
	deref2=deref(dt2);
      }

      toDo.push(std::make_pair(deref1, deref2));
    }
  }
  success=true;

finish:
  if(!success) {
    //if this matching was joined to the previous one, we don't
    //have to care about unbinding as caller will do this by calling
    //backtrack for the matching we're joined to.
    if(separate) {
      //we have to unbind variables, that were bound.
      backtrack();
    }
  }
  return success;
}